

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_SetProps(CLzmaEncHandle pp,CLzmaEncProps *props2)

{
  void *in_RSI;
  long in_RDI;
  UInt32 numHashBytes;
  uint fb;
  CLzmaEncProps props;
  CLzmaEnc *p;
  int local_60;
  uint local_5c;
  CLzmaEncProps local_58;
  long local_20;
  SRes local_4;
  
  local_20 = in_RDI;
  memcpy(&local_58,in_RSI,0x38);
  LzmaEncProps_Normalize(&local_58);
  if ((((local_58.lc < 9) && (local_58.lp < 5)) && (local_58.pb < 5)) &&
     ((local_58.dictSize < 0x80000001 && (local_58.dictSize < 0x60000001)))) {
    *(UInt32 *)(local_20 + 0xac) = local_58.dictSize;
    local_5c = local_58.fb;
    if ((uint)local_58.fb < 5) {
      local_5c = 5;
    }
    if (0x111 < local_5c) {
      local_5c = 0x111;
    }
    *(uint *)(local_20 + 0x44) = local_5c;
    *(int *)(local_20 + 0x60) = local_58.lc;
    *(int *)(local_20 + 100) = local_58.lp;
    *(int *)(local_20 + 0x68) = local_58.pb;
    *(uint *)(local_20 + 0x80) = (uint)(local_58.algo == 0);
    *(bool *)(local_20 + 0x121) = local_58.btMode != 0;
    local_60 = 4;
    if (local_58.btMode != 0) {
      if (local_58.numHashBytes < 2) {
        local_60 = 2;
      }
      else if (local_58.numHashBytes < 4) {
        local_60 = local_58.numHashBytes;
      }
    }
    *(int *)(local_20 + 0x15c) = local_60;
    *(UInt32 *)(local_20 + 0x13c) = local_58.mc;
    *(uint *)(local_20 + 0x84) = local_58.writeEndMark;
    local_4 = 0;
  }
  else {
    local_4 = 5;
  }
  return local_4;
}

Assistant:

SRes LzmaEnc_SetProps(CLzmaEncHandle pp, const CLzmaEncProps *props2)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  CLzmaEncProps props = *props2;
  LzmaEncProps_Normalize(&props);

  if (props.lc > LZMA_LC_MAX
      || props.lp > LZMA_LP_MAX
      || props.pb > LZMA_PB_MAX
      || props.dictSize > ((UInt64)1 << kDicLogSizeMaxCompress)
      || props.dictSize > kMaxHistorySize)
    return SZ_ERROR_PARAM;

  p->dictSize = props.dictSize;
  {
    unsigned fb = props.fb;
    if (fb < 5)
      fb = 5;
    if (fb > LZMA_MATCH_LEN_MAX)
      fb = LZMA_MATCH_LEN_MAX;
    p->numFastBytes = fb;
  }
  p->lc = props.lc;
  p->lp = props.lp;
  p->pb = props.pb;
  p->fastMode = (props.algo == 0);
  p->matchFinderBase.btMode = (Byte)(props.btMode ? 1 : 0);
  {
    UInt32 numHashBytes = 4;
    if (props.btMode)
    {
      if (props.numHashBytes < 2)
        numHashBytes = 2;
      else if (props.numHashBytes < 4)
        numHashBytes = props.numHashBytes;
    }
    p->matchFinderBase.numHashBytes = numHashBytes;
  }

  p->matchFinderBase.cutValue = props.mc;

  p->writeEndMark = props.writeEndMark;

  #ifndef _7ZIP_ST
  /*
  if (newMultiThread != _multiThread)
  {
    ReleaseMatchFinder();
    _multiThread = newMultiThread;
  }
  */
  p->multiThread = (props.numThreads > 1);
  #endif

  return SZ_OK;
}